

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_isset_set(t_dart_generator *this,ostream *out,t_field *field)

{
  bool bVar1;
  t_type *ttype;
  string *psVar2;
  ostream *poVar3;
  string local_60;
  undefined1 local_40 [8];
  string field_name;
  t_field *field_local;
  ostream *out_local;
  t_dart_generator *this_local;
  
  field_name.field_2._8_8_ = field;
  ttype = t_field::get_type(field);
  bVar1 = type_can_be_null(this,ttype);
  if (!bVar1) {
    psVar2 = t_field::get_name_abi_cxx11_((t_field *)field_name.field_2._8_8_);
    std::__cxx11::string::string((string *)&local_60,(string *)psVar2);
    get_member_name((string *)local_40,this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"this.__isset_");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    poVar3 = std::operator<<(poVar3," = true;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void t_dart_generator::generate_isset_set(ostream& out, t_field* field) {
  if (!type_can_be_null(field->get_type())) {
    string field_name = get_member_name(field->get_name());
    indent(out) << "this.__isset_" << field_name << " = true;" << endl;
  }
}